

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O0

char nsvg__parseLineJoin(char *str)

{
  int iVar1;
  char *str_local;
  
  iVar1 = strcmp(str,"miter");
  if (iVar1 == 0) {
    str_local._7_1_ = '\0';
  }
  else {
    iVar1 = strcmp(str,"round");
    if (iVar1 == 0) {
      str_local._7_1_ = '\x01';
    }
    else {
      iVar1 = strcmp(str,"bevel");
      if (iVar1 == 0) {
        str_local._7_1_ = '\x02';
      }
      else {
        str_local._7_1_ = '\0';
      }
    }
  }
  return str_local._7_1_;
}

Assistant:

static char nsvg__parseLineJoin(const char* str)
{
	if (strcmp(str, "miter") == 0)
		return NSVG_JOIN_MITER;
	else if (strcmp(str, "round") == 0)
		return NSVG_JOIN_ROUND;
	else if (strcmp(str, "bevel") == 0)
		return NSVG_JOIN_BEVEL;
	// TODO: handle inherit.
	return NSVG_CAP_BUTT;
}